

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImputerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)601>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  int64 iVar6;
  int64 iVar7;
  Imputer *this;
  DoubleVector *pDVar8;
  Int64Vector *pIVar9;
  FeatureType *this_00;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_04;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_05;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_06;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_07;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_08;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_09;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_10;
  allocator_type local_110;
  allocator_type local_10f;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_10e;
  allocator_type local_10d;
  ReplaceValueCase local_10c;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [2];
  TypeCase local_d0 [2];
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_c8;
  Result result;
  anon_class_24_3_489072cd checkInterfaceCompatible;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  possible_types;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  validateModelDescription((Result *)local_108,interface,format->specificationversion_);
  Result::operator=(&result,(Result *)local_108);
  std::__cxx11::string::~string((string *)&_Stack_100);
  bVar1 = Result::good(&result);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,&result);
    goto LAB_005593f4;
  }
  local_108 = (undefined1  [8])0x200000001;
  _Stack_100._M_p = (pointer)0x300000005;
  local_f8[0]._M_allocated_capacity._0_4_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)local_108;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&possible_types,__l,(allocator_type *)&local_c8);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_108,(CoreML *)&interface->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&possible_types
             ,in_R8);
  Result::operator=(&result,(Result *)local_108);
  std::__cxx11::string::~string((string *)&_Stack_100);
  bVar1 = Result::good(&result);
  if (!bVar1) goto switchD_0055909d_default;
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_108,(CoreML *)&interface->output_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&possible_types
             ,in_R8);
  Result::operator=(&result,(Result *)local_108);
  std::__cxx11::string::~string((string *)&_Stack_100);
  bVar1 = Result::good(&result);
  if (!bVar1) goto switchD_0055909d_default;
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(interface->input_).super_RepeatedPtrFieldBase,0);
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(interface->output_).super_RepeatedPtrFieldBase,0);
  pFVar4 = pTVar3->type_;
  if (pFVar4 == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  this_00 = pTVar2->type_;
  if (this_00 == (FeatureType *)0x0) {
    this_00 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if (pFVar4->_oneof_case_[0] != this_00->_oneof_case_[0]) {
    std::__cxx11::string::string
              ((string *)local_108,"Type of input feature does not match the output type feature.",
               (allocator *)&local_c8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
LAB_00559136:
    std::__cxx11::string::~string((string *)local_108);
    goto LAB_005593e7;
  }
  if (pFVar4->_oneof_case_[0] == 5) {
    pAVar5 = Specification::FeatureType::multiarraytype(this_00);
    if ((pAVar5->shape_).current_size_ == 1) {
      pFVar4 = pTVar3->type_;
      if (pFVar4 == (FeatureType *)0x0) {
        pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar5 = Specification::FeatureType::multiarraytype(pFVar4);
      if ((pAVar5->shape_).current_size_ == 1) {
        pFVar4 = pTVar2->type_;
        if (pFVar4 == (FeatureType *)0x0) {
          pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pAVar5 = Specification::FeatureType::multiarraytype(pFVar4);
        iVar6 = Specification::ArrayFeatureType::shape(pAVar5,0);
        pFVar4 = pTVar3->type_;
        if (pFVar4 == (FeatureType *)0x0) {
          pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pAVar5 = Specification::FeatureType::multiarraytype(pFVar4);
        iVar7 = Specification::ArrayFeatureType::shape(pAVar5,0);
        if (iVar6 == iVar7) goto LAB_0055905f;
      }
      std::__cxx11::string::string
                ((string *)local_108,"Shape of output array does not match shape of input array.",
                 (allocator *)&local_c8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_108,
                 "Only 1 dimensional arrays input features are supported by the imputer.",
                 (allocator *)&local_c8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
    }
    goto LAB_00559136;
  }
LAB_0055905f:
  checkInterfaceCompatible.input = pTVar2;
  checkInterfaceCompatible.result = &result;
  checkInterfaceCompatible.format = format;
  this = Specification::Model::imputer(format);
  switch(this->_oneof_case_[0]) {
  case 0:
    std::__cxx11::string::string
              ((string *)local_108,"Imputer parameter must be set.",(allocator *)&local_c8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
    goto LAB_00559136;
  case 1:
    local_d0[0] = kDoubleType;
    local_d0[1] = kMultiArrayType;
    __l_07._M_len = 2;
    __l_07._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_07,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_110,
          &local_10d);
    local_10c = kReplaceDoubleValue;
    __l_08._M_len = 1;
    __l_08._M_array = &local_10c;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_c8,__l_08,&local_10e,&local_10f);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&checkInterfaceCompatible,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_108,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_c8);
    break;
  case 2:
    local_d0[0] = 1;
    __l_03._M_len = 1;
    __l_03._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_03,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_110,
          &local_10d);
    local_10c = kReplaceInt64Value;
    __l_04._M_len = 1;
    __l_04._M_array = &local_10c;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_c8,__l_04,&local_10e,&local_10f);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&checkInterfaceCompatible,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_108,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_c8);
    break;
  case 3:
    local_d0[0] = 3;
    __l_05._M_len = 1;
    __l_05._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_05,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_110,
          &local_10d);
    local_10c = kReplaceStringValue;
    __l_06._M_len = 1;
    __l_06._M_array = &local_10c;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_c8,__l_06,&local_10e,&local_10f);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&checkInterfaceCompatible,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_108,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_c8);
    break;
  case 4:
    local_d0[0] = 5;
    __l_01._M_len = 1;
    __l_01._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_01,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_110,
          &local_10d);
    local_10c = kReplaceDoubleValue;
    __l_02._M_len = 1;
    __l_02._M_array = &local_10c;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_c8,__l_02,&local_10e,&local_10f);
    bVar1 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&checkInterfaceCompatible,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_108,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_c8);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_c8);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_108);
    if (bVar1) {
      pFVar4 = pTVar2->type_;
      if (pFVar4 == (FeatureType *)0x0) {
        pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar5 = Specification::FeatureType::multiarraytype(pFVar4);
      iVar6 = Specification::ArrayFeatureType::shape(pAVar5,0);
      pDVar8 = Specification::Imputer::imputeddoublearray(this);
      if (iVar6 != (pDVar8->vector_).current_size_) {
        std::__cxx11::string::string
                  ((string *)local_108,
                   "Shape of imputed array value does not match shape of input array.",
                   (allocator *)&local_c8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
        goto LAB_00559136;
      }
    }
    goto switchD_0055909d_default;
  case 5:
    local_d0[0] = 5;
    __l_09._M_len = 1;
    __l_09._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_09,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_110,
          &local_10d);
    local_10c = kReplaceInt64Value;
    __l_10._M_len = 1;
    __l_10._M_array = &local_10c;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_c8,__l_10,&local_10e,&local_10f);
    bVar1 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&checkInterfaceCompatible,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_108,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_c8);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_c8);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_108);
    if (bVar1) {
      pFVar4 = pTVar2->type_;
      if (pFVar4 == (FeatureType *)0x0) {
        pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar5 = Specification::FeatureType::multiarraytype(pFVar4);
      iVar6 = Specification::ArrayFeatureType::shape(pAVar5,0);
      pIVar9 = Specification::Imputer::imputedint64array(this);
      if (iVar6 != (pIVar9->vector_).current_size_) {
        std::__cxx11::string::string
                  ((string *)local_108,
                   "Shape of imputed array value does not match shape of input array.",
                   (allocator *)&local_c8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
        goto LAB_00559136;
      }
    }
    goto switchD_0055909d_default;
  case 6:
  case 7:
    local_d0[0] = 6;
    __l_00._M_len = 1;
    __l_00._M_array = local_d0;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_108,__l_00,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_10c,
          &local_110);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&checkInterfaceCompatible,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_108,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_c8);
    break;
  default:
    goto switchD_0055909d_default;
  }
  std::
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_108);
switchD_0055909d_default:
  Result::Result(__return_storage_ptr__,&result);
LAB_005593e7:
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&possible_types.
                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 );
LAB_005593f4:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_imputer>(const Specification::Model& format) {
        const auto& description = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        
        std::vector<Specification::FeatureType::TypeCase> possible_types = {
            FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType,
            FT::kStringType, FT::kDictionaryType};
        
        // Validate the inputs, though we'll have to do more of this manually.
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
            // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];
        
        // make sure the input and the output match.
        if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }
        
        // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Only 1 dimensional arrays input features are supported by the imputer.");
            }
            
            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Shape of output array does not match shape of input array.");
            }
        }
        
           
        // Input and output types are allowed based on the values present in the
        auto checkInterfaceCompatible =
        [&](const std::set<Specification::FeatureType::TypeCase>& compatibleFeatureTypes,
            const std::set<Specification::Imputer::ReplaceValueCase>& compatibleReplaceTypes) {
            
            if(!compatibleFeatureTypes.count(input.type().Type_case())) {
                result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                       "Type of input feature \"" + input.name() + "\" is not compatible with given imputed value type.");
                return false;
            }
            
            
            // Check to make sure the the replace value is fine
            if(format.imputer().ReplaceValue_case() != Specification::Imputer::REPLACEVALUE_NOT_SET) {
                if(!compatibleReplaceTypes.count(format.imputer().ReplaceValue_case())) {
                    result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Type of given replace value not compatible with input feature type.");
                    return false;
                }
            }
            
            // We're all okay now.
            return true;
        };
               
        // Validate the different combinations of stuff.
        const auto& imputer = format.imputer();
        switch (imputer.ImputedValue_case()) {
            case Specification::Imputer::kImputedDoubleValue:
                if(!checkInterfaceCompatible({FT::kDoubleType, FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                        return result;
                    }
                break;
                
            case Specification::Imputer::kImputedInt64Value:
                if(!checkInterfaceCompatible({FT::kInt64Type}, {RVC::kReplaceInt64Value})) {
                        return result;
                    }
                break;
            case Specification::Imputer::kImputedDoubleArray:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputeddoublearray().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                
                break;
            case Specification::Imputer::kImputedStringValue:
                if(!checkInterfaceCompatible({FT::kStringType}, {RVC::kReplaceStringValue})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::kImputedInt64Array:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceInt64Value})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputedint64array().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                break;
                    
            case Specification::Imputer::kImputedStringDictionary:
            case Specification::Imputer::kImputedInt64Dictionary:
                    // This only works with a full on ungiven replacement value.
                if(!checkInterfaceCompatible({FT::kDictionaryType}, {})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::IMPUTEDVALUE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Imputer parameter must be set.");
                break;
        }

        return result;
    }